

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O1

void __thiscall
chrono::utils::Generator::createObjects(Generator *this,PointVector *points,ChVector<double> *vel)

{
  ChBodyFrame *this_00;
  element_type *peVar1;
  MixtureIngredient *pMVar2;
  pointer pCVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ChSystem *pCVar6;
  long *plVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  ChBody *this_01;
  ulong uVar12;
  long lVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  ulong uVar15;
  shared_ptr<chrono::ChMaterialSurface> mat;
  shared_ptr<chrono::ChBody> bodyPtr;
  shared_ptr<chrono::ChMaterialSurfaceSMC> matSMC;
  ChVector<double> size;
  vector<bool,_std::allocator<bool>_> flags;
  ChVector<double> gyration;
  double volume;
  ChMaterialSurfaceSMC *local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_260;
  ChVector<double> local_258;
  BodyInfo local_240;
  ChVector<double> local_208;
  vector<bool,_std::allocator<bool>_> local_1f0;
  PointVector *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  ChBody *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  ChBody *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  shared_ptr<chrono::ChMaterialSurface> local_198;
  shared_ptr<chrono::ChMaterialSurface> local_188;
  shared_ptr<chrono::ChMaterialSurface> local_178;
  shared_ptr<chrono::ChMaterialSurface> local_168;
  shared_ptr<chrono::ChMaterialSurface> local_158;
  shared_ptr<chrono::ChMaterialSurface> local_148;
  shared_ptr<chrono::ChMaterialSurface> local_138;
  shared_ptr<chrono::ChMaterialSurface> local_128;
  shared_ptr<chrono::ChMaterialSurfaceSMC> local_118;
  shared_ptr<chrono::ChMaterialSurfaceNSC> local_108;
  ChVector<double> local_f8;
  double local_d8;
  vector<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
  *local_d0;
  ChVector<double> *local_c8;
  element_type *local_c0;
  double local_b8;
  shared_ptr<chrono::ChVisualMaterial> local_b0;
  shared_ptr<chrono::ChVisualMaterial> local_a0;
  shared_ptr<chrono::ChVisualMaterial> local_90;
  shared_ptr<chrono::ChVisualMaterial> local_80;
  shared_ptr<chrono::ChVisualMaterial> local_70;
  shared_ptr<chrono::ChVisualMaterial> local_60;
  shared_ptr<chrono::ChVisualMaterial> local_50;
  shared_ptr<chrono::ChVisualMaterial> local_40;
  undefined4 extraout_var;
  
  local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_c0 = (this->m_callback).
             super___shared_ptr<chrono::utils::Generator::CreateObjectsCallback,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_c8 = vel;
  if (local_c0 != (element_type *)0x0) {
    std::vector<bool,_std::allocator<bool>_>::resize
              (&local_1f0,
               ((long)(points->
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(points->
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,true);
    peVar1 = (this->m_callback).
             super___shared_ptr<chrono::utils::Generator::CreateObjectsCallback,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (**(code **)(*(long *)peVar1 + 0x10))(peVar1,points,&local_1f0);
  }
  if ((points->
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish ==
      (points->
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    uVar12 = 0;
  }
  else {
    local_d0 = &this->m_bodies;
    lVar13 = 0;
    uVar15 = 0;
    local_1c8 = points;
    do {
      if ((local_c0 == (element_type *)0x0) ||
         ((local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0)) {
        iVar10 = selectIngredient(this);
        local_268 = (ChMaterialSurfaceSMC *)0x0;
        _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        iVar11 = (*(this->m_system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable
                   [0x2f])();
        if (iVar11 == 0) {
          local_240._0_8_ = (ChMaterialSurfaceSMC *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::ChMaterialSurfaceNSC,std::allocator<chrono::ChMaterialSurfaceNSC>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_240.m_density,
                     (ChMaterialSurfaceNSC **)&local_240,
                     (allocator<chrono::ChMaterialSurfaceNSC> *)&local_208);
          pMVar2 = (this->m_mixture).
                   super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].
                   super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_108.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_240._0_8_;
          local_108.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240.m_density;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240.m_density !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)local_240.m_density + 8) =
                   *(_Atomic_word *)((long)local_240.m_density + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)local_240.m_density + 8) =
                   *(_Atomic_word *)((long)local_240.m_density + 8) + 1;
            }
          }
          MixtureIngredient::setMaterialProperties(pMVar2,&local_108);
          _Var14._M_pi = local_108.
                         super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
LAB_009439d6:
          if (_Var14._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var14._M_pi);
          }
          local_268 = (ChMaterialSurfaceSMC *)local_240._0_8_;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&_Stack_260,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_240.m_density)
          ;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240.m_density !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240.m_density);
          }
        }
        else if (iVar11 == 1) {
          local_240._0_8_ = (ChMaterialSurfaceSMC *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::ChMaterialSurfaceSMC,std::allocator<chrono::ChMaterialSurfaceSMC>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_240.m_density,
                     (ChMaterialSurfaceSMC **)&local_240,
                     (allocator<chrono::ChMaterialSurfaceSMC> *)&local_208);
          pMVar2 = (this->m_mixture).
                   super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].
                   super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_118.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_240._0_8_;
          local_118.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240.m_density;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240.m_density !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)local_240.m_density + 8) =
                   *(_Atomic_word *)((long)local_240.m_density + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)local_240.m_density + 8) =
                   *(_Atomic_word *)((long)local_240.m_density + 8) + 1;
            }
          }
          MixtureIngredient::setMaterialProperties(pMVar2,&local_118);
          _Var14._M_pi = local_118.
                         super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
          goto LAB_009439d6;
        }
        iVar11 = (*(this->m_system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable
                   [0x30])();
        this_01 = (ChBody *)CONCAT44(extraout_var,iVar11);
        iVar11 = this->m_crtBodyId;
        this->m_crtBodyId = iVar11 + 1;
        (this_01->super_ChPhysicsItem).super_ChObj.m_identifier = iVar11;
        pCVar3 = (local_1c8->
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ChCoordsys<double> *)((long)pCVar3->m_data + lVar13) !=
            &(this_01->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord) {
          (this_01->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
          m_data[0] = *(double *)((long)pCVar3->m_data + lVar13);
          (this_01->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
          m_data[1] = *(double *)((long)pCVar3->m_data + lVar13 + 8);
          (this_01->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
          m_data[2] = *(double *)((long)pCVar3->m_data + lVar13 + 0x10);
        }
        this_00 = &this_01->super_ChBodyFrame;
        local_240._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
        local_240.m_density = 0.0;
        local_240.m_size.m_data[0] = 0.0;
        local_240.m_size.m_data[1] = 0.0;
        ChFrame<double>::SetRot((ChFrame<double> *)this_00,(ChQuaternion<double> *)&local_240);
        (*(this_00->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[7])(this_00);
        ChBody::SetBodyFixed(this_01,false);
        ChBody::SetCollide(this_01,true);
        MixtureIngredient::getSize
                  (&local_208,
                   (this->m_mixture).
                   super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].
                   super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        local_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    MixtureIngredient::getDensity
                              ((this->m_mixture).
                               super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar10].
                               super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
        local_f8.m_data[0] = 0.0;
        local_f8.m_data[1] = 0.0;
        local_f8.m_data[2] = 0.0;
        MixtureIngredient::calcGeometricProps
                  ((this->m_mixture).
                   super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].
                   super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&local_208,&local_b8,&local_f8);
        dVar9 = local_b8;
        dVar8 = local_b8 * (double)local_1c0;
        ChVariablesBodyOwnMass::SetBodyMass(&this_01->variables,dVar8);
        local_240._0_8_ = dVar8 * local_f8.m_data[0];
        local_240.m_density = dVar8 * local_f8.m_data[1];
        local_240.m_size.m_data[0] = dVar8 * local_f8.m_data[2];
        ChBody::SetInertiaXX(this_01,(ChVector<double> *)&local_240);
        this->m_totalMass = dVar8 + this->m_totalMass;
        this->m_totalVolume = dVar9 + this->m_totalVolume;
        peVar4 = (this_01->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var5 = (this_01->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          }
        }
        (*peVar4->_vptr_ChCollisionModel[3])();
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
        dVar9 = local_208.m_data[1];
        dVar8 = local_208.m_data[0];
        switch(((this->m_mixture).
                super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar10].
                super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->m_type) {
        case SPHERE:
          local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = &local_268->super_ChMaterialSurface;
          local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_260._M_pi;
          if (_Stack_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_260._M_pi)->_M_use_count = (_Stack_260._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_260._M_pi)->_M_use_count = (_Stack_260._M_pi)->_M_use_count + 1;
            }
          }
          local_258.m_data[2] = 0.0;
          local_258.m_data[0] = 0.0;
          local_258.m_data[1] = 0.0;
          local_240._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
          local_240.m_size.m_data[1] = 0.0;
          local_240.m_density = 0.0;
          local_240.m_size.m_data[0] = 0.0;
          ChVisualMaterial::Default();
          AddSphereGeometry(this_01,&local_128,dVar8,&local_258,(ChQuaternion<double> *)&local_240,
                            true,&local_40);
          _Var14._M_pi = local_128.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_40.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var14._M_pi = local_128.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          break;
        case ELLIPSOID:
          local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = &local_268->super_ChMaterialSurface;
          local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_260._M_pi;
          if (_Stack_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_260._M_pi)->_M_use_count = (_Stack_260._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_260._M_pi)->_M_use_count = (_Stack_260._M_pi)->_M_use_count + 1;
            }
          }
          local_258.m_data[0] = 0.0;
          local_258.m_data[1] = 0.0;
          local_258.m_data[2] = 0.0;
          local_240._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
          local_240.m_size.m_data[1] = 0.0;
          local_240.m_density = 0.0;
          local_240.m_size.m_data[0] = 0.0;
          ChVisualMaterial::Default();
          AddEllipsoidGeometry
                    (this_01,&local_138,&local_208,&local_258,(ChQuaternion<double> *)&local_240,
                     true,&local_50);
          _Var14._M_pi = local_138.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_50.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var14._M_pi = local_138.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          break;
        case BOX:
          local_148.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = &local_268->super_ChMaterialSurface;
          local_148.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_260._M_pi;
          if (_Stack_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_260._M_pi)->_M_use_count = (_Stack_260._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_260._M_pi)->_M_use_count = (_Stack_260._M_pi)->_M_use_count + 1;
            }
          }
          local_258.m_data[0] = 0.0;
          local_258.m_data[1] = 0.0;
          local_258.m_data[2] = 0.0;
          local_240._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
          local_240.m_size.m_data[1] = 0.0;
          local_240.m_density = 0.0;
          local_240.m_size.m_data[0] = 0.0;
          ChVisualMaterial::Default();
          AddBoxGeometry(this_01,&local_148,&local_208,&local_258,(ChQuaternion<double> *)&local_240
                         ,true,&local_60);
          _Var14._M_pi = local_148.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_60.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_60.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var14._M_pi = local_148.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          break;
        case CYLINDER:
          local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = &local_268->super_ChMaterialSurface;
          local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_260._M_pi;
          if (_Stack_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_260._M_pi)->_M_use_count = (_Stack_260._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_260._M_pi)->_M_use_count = (_Stack_260._M_pi)->_M_use_count + 1;
            }
          }
          local_258.m_data[2] = 0.0;
          local_258.m_data[0] = 0.0;
          local_258.m_data[1] = 0.0;
          local_240._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
          local_240.m_size.m_data[1] = 0.0;
          local_240.m_density = 0.0;
          local_240.m_size.m_data[0] = 0.0;
          ChVisualMaterial::Default();
          AddCylinderGeometry(this_01,&local_158,dVar8,dVar9,&local_258,
                              (ChQuaternion<double> *)&local_240,true,&local_70);
          _Var14._M_pi = local_158.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_70.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var14._M_pi = local_158.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          break;
        case CONE:
          local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = &local_268->super_ChMaterialSurface;
          local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_260._M_pi;
          if (_Stack_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_260._M_pi)->_M_use_count = (_Stack_260._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_260._M_pi)->_M_use_count = (_Stack_260._M_pi)->_M_use_count + 1;
            }
          }
          local_258.m_data[2] = 0.0;
          local_258.m_data[0] = 0.0;
          local_258.m_data[1] = 0.0;
          local_240._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
          local_240.m_size.m_data[1] = 0.0;
          local_240.m_density = 0.0;
          local_240.m_size.m_data[0] = 0.0;
          ChVisualMaterial::Default();
          AddConeGeometry(this_01,&local_168,dVar8,dVar9,&local_258,
                          (ChQuaternion<double> *)&local_240,true,&local_80);
          _Var14._M_pi = local_168.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_80.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_80.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var14._M_pi = local_168.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          break;
        case CAPSULE:
          local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = &local_268->super_ChMaterialSurface;
          local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_260._M_pi;
          if (_Stack_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_260._M_pi)->_M_use_count = (_Stack_260._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_260._M_pi)->_M_use_count = (_Stack_260._M_pi)->_M_use_count + 1;
            }
          }
          local_258.m_data[2] = 0.0;
          local_258.m_data[0] = 0.0;
          local_258.m_data[1] = 0.0;
          local_240._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
          local_240.m_size.m_data[1] = 0.0;
          local_240.m_density = 0.0;
          local_240.m_size.m_data[0] = 0.0;
          ChVisualMaterial::Default();
          AddCapsuleGeometry(this_01,&local_188,dVar8,dVar9,&local_258,
                             (ChQuaternion<double> *)&local_240,true,&local_a0);
          _Var14._M_pi = local_188.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_a0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a0.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var14._M_pi = local_188.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          break;
        case BISPHERE:
          local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = &local_268->super_ChMaterialSurface;
          local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_260._M_pi;
          if (_Stack_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_260._M_pi)->_M_use_count = (_Stack_260._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_260._M_pi)->_M_use_count = (_Stack_260._M_pi)->_M_use_count + 1;
            }
          }
          local_258.m_data[2] = 0.0;
          local_258.m_data[0] = 0.0;
          local_258.m_data[1] = 0.0;
          local_240._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
          local_240.m_size.m_data[1] = 0.0;
          local_240.m_density = 0.0;
          local_240.m_size.m_data[0] = 0.0;
          ChVisualMaterial::Default();
          AddBiSphereGeometry(this_01,&local_178,dVar8,dVar9,&local_258,
                              (ChQuaternion<double> *)&local_240,true,&local_90);
          _Var14._M_pi = local_178.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_90.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var14._M_pi = local_178.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          break;
        case ROUNDEDCYLINDER:
          local_198.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = &local_268->super_ChMaterialSurface;
          local_198.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_260._M_pi;
          if (_Stack_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_260._M_pi)->_M_use_count = (_Stack_260._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_260._M_pi)->_M_use_count = (_Stack_260._M_pi)->_M_use_count + 1;
            }
          }
          local_d8 = local_208.m_data[2];
          local_258.m_data[2] = 0.0;
          local_258.m_data[0] = 0.0;
          local_258.m_data[1] = 0.0;
          local_240._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
          local_240.m_size.m_data[1] = 0.0;
          local_240.m_density = 0.0;
          local_240.m_size.m_data[0] = 0.0;
          ChVisualMaterial::Default();
          AddRoundedCylinderGeometry
                    (this_01,&local_198,dVar8,dVar9,local_d8,&local_258,
                     (ChQuaternion<double> *)&local_240,true,&local_b0);
          _Var14._M_pi = local_198.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_b0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b0.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var14._M_pi = local_198.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          break;
        default:
          goto switchD_00943c22_default;
        }
        if (_Var14._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var14._M_pi);
        }
switchD_00943c22_default:
        peVar4 = (this_01->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var5 = (this_01->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          }
        }
        (*peVar4->_vptr_ChCollisionModel[4])();
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
        local_258.m_data[0] = (double)this_01;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258.m_data + 1),this_01);
        points = local_1c8;
        pCVar6 = this->m_system;
        local_1a8 = (ChBody *)local_258.m_data[0];
        local_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.m_data[1];
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.m_data[1] !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)((long)local_258.m_data[1] + 8) =
                 *(_Atomic_word *)((long)local_258.m_data[1] + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)((long)local_258.m_data[1] + 8) =
                 *(_Atomic_word *)((long)local_258.m_data[1] + 8) + 1;
          }
        }
        (*(pCVar6->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x25])
                  (pCVar6,&local_1a8);
        if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
        }
        plVar7 = *(long **)&(((this->m_mixture).
                              super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar10].
                              super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->add_body_callback).
                            super___shared_ptr<chrono::utils::MixtureIngredient::AddBodyCallback,_(__gnu_cxx::_Lock_policy)2>
        ;
        if (plVar7 != (long *)0x0) {
          local_1b8 = (ChBody *)local_258.m_data[0];
          local_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.m_data[1];
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.m_data[1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)local_258.m_data[1] + 8) =
                   *(_Atomic_word *)((long)local_258.m_data[1] + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)local_258.m_data[1] + 8) =
                   *(_Atomic_word *)((long)local_258.m_data[1] + 8) + 1;
            }
          }
          (**(code **)(*plVar7 + 0x10))(plVar7,&local_1b8);
          if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0);
          }
        }
        local_240.m_type =
             ((this->m_mixture).
              super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar10].
              super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->m_type;
        local_240.m_density = (double)local_1c0;
        local_240.m_size.m_data[0] = local_208.m_data[0];
        local_240.m_size.m_data[1] = local_208.m_data[1];
        local_240.m_size.m_data[2] = local_208.m_data[2];
        local_240.m_body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_258.m_data[0];
        local_240.m_body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.m_data[1];
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.m_data[1] !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)((long)local_258.m_data[1] + 8) =
                 *(_Atomic_word *)((long)local_258.m_data[1] + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)((long)local_258.m_data[1] + 8) =
                 *(_Atomic_word *)((long)local_258.m_data[1] + 8) + 1;
          }
        }
        std::
        vector<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
        ::emplace_back<chrono::utils::Generator::BodyInfo>(local_d0,&local_240);
        if (local_240.m_body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_240.m_body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.m_data[1] !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258.m_data[1]);
        }
        if (_Stack_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_260._M_pi);
        }
      }
      uVar15 = uVar15 + 1;
      uVar12 = ((long)(points->
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(points->
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar13 = lVar13 + 0x18;
    } while (uVar15 <= uVar12 && uVar12 - uVar15 != 0);
  }
  this->m_totalNumBodies = this->m_totalNumBodies + (int)uVar12;
  if (local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_1f0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void Generator::createObjects(const PointVector& points, const ChVector<>& vel) {
    bool check = false;
    std::vector<bool> flags;
    if (m_callback) {
        flags.resize(points.size(), true);
        m_callback->OnCreateObjects(points, flags);
        check = true;
    }

    for (int i = 0; i < points.size(); i++) {
        if (check && !flags[i])
            continue;

        // Select the type of object to be created.
        int index = selectIngredient();

        // Create a contact material consistent with the associated system and modify it based on attributes of the
        // current ingredient.
        std::shared_ptr<ChMaterialSurface> mat;
        switch (m_system->GetContactMethod()) {
            case ChContactMethod::NSC: {
                auto matNSC = chrono_types::make_shared<ChMaterialSurfaceNSC>();
                m_mixture[index]->setMaterialProperties(matNSC);
                mat = matNSC;
                break;
            }
            case ChContactMethod::SMC: {
                auto matSMC = chrono_types::make_shared<ChMaterialSurfaceSMC>();
                m_mixture[index]->setMaterialProperties(matSMC);
                mat = matSMC;
                break;
            }
        }

        // Create the body (with appropriate collision model, consistent with the associated system)
        ChBody* body = m_system->NewBody();

        // Set identifier
        body->SetIdentifier(m_crtBodyId++);

        // Set position and orientation
        body->SetPos(points[i]);
        body->SetRot(ChQuaternion<>(1, 0, 0, 0));
        body->SetPos_dt(vel);
        body->SetBodyFixed(false);
        body->SetCollide(true);

        // Get size and density; calculate geometric properties
        ChVector<> size = m_mixture[index]->getSize();
        double density = m_mixture[index]->getDensity();
        double volume;
        ChVector<> gyration;
        m_mixture[index]->calcGeometricProps(size, volume, gyration);
        double mass = density * volume;

        // Set mass properties
        body->SetMass(mass);
        body->SetInertiaXX(mass * gyration);
        m_totalMass += mass;
        m_totalVolume += volume;

        // Add collision geometry
        body->GetCollisionModel()->ClearModel();

        switch (m_mixture[index]->m_type) {
            case MixtureType::SPHERE:
                AddSphereGeometry(body, mat, size.x());
                break;
            case MixtureType::ELLIPSOID:
                AddEllipsoidGeometry(body, mat, size);
                break;
            case MixtureType::BOX:
                AddBoxGeometry(body, mat, size);
                break;
            case MixtureType::CYLINDER:
                AddCylinderGeometry(body, mat, size.x(), size.y());
                break;
            case MixtureType::CONE:
                AddConeGeometry(body, mat, size.x(), size.y());
                break;
            case MixtureType::BISPHERE:
            	AddBiSphereGeometry(body, mat, size.x(), size.y());
                break;
            case MixtureType::CAPSULE:
                AddCapsuleGeometry(body, mat, size.x(), size.y());
                break;
            case MixtureType::ROUNDEDCYLINDER:
                AddRoundedCylinderGeometry(body, mat, size.x(), size.y(), size.z());
                break;
        }

        body->GetCollisionModel()->BuildModel();

        // Attach the body to the system and append to list of generated bodies.
        std::shared_ptr<ChBody> bodyPtr(body);

        m_system->AddBody(bodyPtr);

        // If the callback pointer is set, call the function with the body pointer
        if (m_mixture[index]->add_body_callback) {
            m_mixture[index]->add_body_callback->OnAddBody(bodyPtr);
        }

        m_bodies.push_back(BodyInfo(m_mixture[index]->m_type, density, size, bodyPtr));
    }

    m_totalNumBodies += (unsigned int)points.size();
}